

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

FDynamicColormap * __thiscall F3DFloor::GetColormap(F3DFloor *this)

{
  uint32 uVar1;
  FDynamicColormap *pFVar2;
  F3DFloor *this_local;
  
  uVar1 = PalEntry::operator_cast_to_unsigned_int(&this->target->ColorMap->Fade);
  if (((uVar1 != 0) ||
      (uVar1 = PalEntry::operator_cast_to_unsigned_int(&this->model->ColorMap->Fade), uVar1 != 0))
     && ((this->flags & 0x8001000) == 0)) {
    pFVar2 = GetSpecialLights((PalEntry)(this->model->ColorMap->Color).field_0.field_0,
                              (PalEntry)(this->target->ColorMap->Fade).field_0.field_0,
                              this->model->ColorMap->Desaturate);
    return pFVar2;
  }
  return this->model->ColorMap;
}

Assistant:

FDynamicColormap *F3DFloor::GetColormap()
{
	// If there's no fog in either model or target sector this is easy and fast.
	if ((target->ColorMap->Fade == 0 && model->ColorMap->Fade == 0) || (flags & (FF_FADEWALLS|FF_FOG)))
	{
		return model->ColorMap;
	}
	else
	{
		// We must create a new colormap combining the properties we need
		return GetSpecialLights(model->ColorMap->Color, target->ColorMap->Fade, model->ColorMap->Desaturate);
	}
}